

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O3

string * __thiscall
pbrt::PMJ02BNSampler::ToString_abi_cxx11_(string *__return_storage_ptr__,PMJ02BNSampler *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::Point2<int>const&,int_const&,int_const&,int_const&,int_const&,pstd::vector<pbrt::Point2<float>,pstd::pmr::polymorphic_allocator<pbrt::Point2<float>>>*const&>
            (__return_storage_ptr__,
             "[ PMJ02BNSampler pixel: %s sampleIndex: %d dimension: %d samplesPerPixel: %d pixelTileSize: %d pixelSamples: %p ]"
             ,&this->pixel,&this->sampleIndex,&this->dimension,&this->samplesPerPixel,
             &this->pixelTileSize,&this->pixelSamples);
  return __return_storage_ptr__;
}

Assistant:

std::string PMJ02BNSampler::ToString() const {
    return StringPrintf("[ PMJ02BNSampler pixel: %s sampleIndex: %d dimension: %d "
                        "samplesPerPixel: %d pixelTileSize: %d pixelSamples: %p ]",
                        pixel, sampleIndex, dimension, samplesPerPixel, pixelTileSize,
                        pixelSamples);
}